

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::set_value(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,string_t *v)

{
  constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  int iVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  allocator local_183;
  allocator local_182;
  allocator local_181;
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    iVar2 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,v);
    if ((char)iVar2 == '\0') {
      this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_e0,"Invalid value: \"",&local_181);
      std::__cxx11::string::string((string *)&local_c0,local_e0);
      std::__cxx11::string::string((string *)&local_100,(string *)v);
      std::operator+(&local_a0,&local_c0,&local_100);
      std::__cxx11::string::string
                (local_140,"\". Value must match to the constraint in tag \"",&local_182);
      std::__cxx11::string::string((string *)&local_120,local_140);
      std::operator+(&local_80,&local_a0,&local_120);
      std::operator+(&local_60,&local_80,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
      std::__cxx11::string::string(local_180,"\".",&local_183);
      std::__cxx11::string::string((string *)&local_160,local_180);
      std::operator+(&local_40,&local_60,&local_160);
      exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_40);
      __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->m_value);
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  return;
}

Assistant:

void
	set_value( const typename Trait::string_t & v )
	{
		if( m_constraint )
		{
			if( !m_constraint->check( v ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					format_t< typename Trait::string_t, Trait >::to_string( v ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\"." ) );
		}

		m_value = v;

		this->set_defined();
	}